

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O3

int fB(sunrealtype t,N_Vector c,N_Vector cB,N_Vector cBdot,void *user_data)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  double *pdVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  sunrealtype (*acoef) [6];
  sunrealtype gu [6];
  double local_68 [5];
  undefined8 local_40;
  
  lVar9 = N_VGetArrayPointer();
  lVar10 = N_VGetArrayPointer(cB);
  lVar11 = N_VGetArrayPointer();
  uVar6 = *(uint *)((long)user_data + 0x40);
  lVar12 = (long)(int)uVar6;
  uVar7 = *(uint *)((long)user_data + 0x44);
  dVar3 = *(double *)((long)user_data + 0x310);
  dVar4 = *(double *)((long)user_data + 0x318);
  uVar19 = (ulong)uVar6;
  if (0 < lVar12) {
    memset(local_68,0,uVar19 * 8);
  }
  lVar34 = (long)user_data + 0x328;
  lVar18 = (long)user_data + 0x4e28;
  local_40 = 0x3ff0000000000000;
  lVar1 = (long)(int)uVar7 * 8;
  lVar2 = lVar12 * 8;
  lVar31 = 0;
  lVar25 = 0;
  lVar21 = lVar9;
  lVar36 = lVar10;
  do {
    uVar27 = uVar7;
    if (lVar25 == 0x13) {
      uVar27 = -uVar7;
    }
    uVar29 = -uVar7;
    if (lVar25 == 0) {
      uVar29 = uVar7;
    }
    uVar30 = (ulong)(uVar29 + (int)lVar31);
    uVar28 = (ulong)(uVar27 + (int)lVar31);
    lVar20 = 0;
    lVar13 = lVar21;
    lVar14 = lVar18;
    lVar24 = lVar31;
    lVar33 = lVar34;
    lVar35 = lVar36;
    do {
      if (0 < (int)uVar6) {
        lVar15 = lVar20 * lVar12 + lVar25 * (int)uVar7;
        lVar32 = lVar9 + lVar15 * 8;
        uVar16 = 0;
        do {
          *(double *)(lVar33 + uVar16 * 8) =
               *(double *)((long)user_data + uVar16 * 8 + 0x250) *
               ((double)(int)lVar20 * dVar3 * (double)(int)lVar25 * dVar4 + 1.0);
          uVar16 = uVar16 + 1;
        } while (uVar19 != uVar16);
        uVar16 = 0;
        pdVar23 = (double *)((long)user_data + 0x130);
        do {
          uVar17 = 0;
          pdVar26 = pdVar23;
          do {
            *(double *)(lVar33 + uVar17 * 8) =
                 *pdVar26 * *(double *)(lVar32 + uVar16 * 8) + *(double *)(lVar33 + uVar17 * 8);
            uVar17 = uVar17 + 1;
            pdVar26 = pdVar26 + 6;
          } while (uVar19 != uVar17);
          uVar16 = uVar16 + 1;
          pdVar23 = pdVar23 + 1;
        } while (uVar16 != uVar19);
        uVar16 = 0;
        do {
          dVar5 = *(double *)(lVar33 + uVar16 * 8);
          *(double *)(lVar33 + 0x4b00 + uVar16 * 8) = *(double *)(lVar35 + uVar16 * 8) * dVar5;
          *(double *)(lVar33 + uVar16 * 8) = dVar5 * *(double *)(lVar13 + uVar16 * 8);
          uVar16 = uVar16 + 1;
        } while (uVar19 != uVar16);
        uVar16 = 0;
        pdVar23 = (double *)((long)user_data + 0x130);
        do {
          uVar17 = 0;
          do {
            *(double *)(lVar14 + uVar17 * 8) =
                 pdVar23[uVar17] * *(double *)(lVar32 + uVar16 * 8) *
                 *(double *)(lVar10 + lVar15 * 8 + uVar16 * 8) + *(double *)(lVar14 + uVar17 * 8);
            uVar17 = uVar17 + 1;
          } while (uVar19 != uVar17);
          uVar16 = uVar16 + 1;
          pdVar23 = pdVar23 + 6;
        } while (uVar16 != uVar19);
        uVar27 = uVar6;
        if (lVar20 == 0x13) {
          uVar27 = -uVar6;
        }
        uVar29 = -uVar6;
        if (lVar20 == 0) {
          uVar29 = uVar6;
        }
        if (0 < (int)uVar6) {
          iVar22 = (int)lVar24;
          lVar32 = 0;
          do {
            iVar8 = (int)lVar32;
            lVar15 = (long)(iVar22 + iVar8);
            dVar5 = *(double *)(lVar10 + lVar15 * 8);
            *(double *)(lVar11 + lVar15 * 8) =
                 ((-*(double *)((long)user_data + lVar32 * 8 + 0x2e0) *
                   ((*(double *)(lVar10 + (long)((int)uVar28 + iVar8) * 8) - dVar5) -
                   (dVar5 - *(double *)(lVar10 + (long)((int)uVar30 + iVar8) * 8))) -
                  ((*(double *)(lVar10 + (long)(int)(uVar27 + iVar22 + iVar8) * 8) - dVar5) -
                  (dVar5 - *(double *)(lVar10 + (long)(int)(uVar29 + iVar22 + iVar8) * 8))) *
                  *(double *)((long)user_data + lVar32 * 8 + 0x2b0)) -
                 *(double *)((long)user_data + lVar15 * 8 + 0x4e28)) - local_68[lVar32];
            lVar32 = lVar32 + 1;
          } while ((ulong)(uVar6 + 1) - 1 != lVar32);
        }
      }
      lVar20 = lVar20 + 1;
      lVar33 = lVar33 + lVar2;
      lVar13 = lVar13 + lVar2;
      lVar35 = lVar35 + lVar2;
      lVar14 = lVar14 + lVar2;
      lVar24 = lVar24 + uVar19;
      uVar30 = uVar30 + uVar19;
      uVar28 = uVar28 + uVar19;
    } while (lVar20 != 0x14);
    lVar25 = lVar25 + 1;
    lVar34 = lVar34 + lVar1;
    lVar21 = lVar21 + lVar1;
    lVar36 = lVar36 + lVar1;
    lVar18 = lVar18 + lVar1;
    lVar31 = lVar31 + (ulong)uVar7;
  } while (lVar25 != 0x14);
  return 0;
}

Assistant:

static int fB(sunrealtype t, N_Vector c, N_Vector cB, N_Vector cBdot,
              void* user_data)
{
  int i, ic, ici, idxl, idxu, idyl, idyu, iyoff, jx, jy, ns, mxns;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, *fBsave, dx,
    dy;
  sunrealtype *cdata, *cBdata, *cBdotdata;
  WebData wdata;

  sunrealtype gu[NS];

  wdata     = (WebData)user_data;
  cdata     = N_VGetArrayPointer(c);
  cBdata    = N_VGetArrayPointer(cB);
  cBdotdata = N_VGetArrayPointer(cBdot);

  mxns   = wdata->mxns;
  ns     = wdata->ns;
  fsave  = wdata->fsave;
  fBsave = wdata->fBsave;
  cox    = wdata->cox;
  coy    = wdata->coy;
  mxns   = wdata->mxns;
  dx     = wdata->dx;
  dy     = wdata->dy;

  for (i = 0; i < ns; i++) { gu[i] = ZERO; }
  gu[ISPEC - 1] = ONE;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRatesB(x, y, t, cdata + ic, cBdata + ic, fsave + ic, fBsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cBdata[ici] - cBdata[ici - idyl];
        dcyui = cBdata[ici + idyu] - cBdata[ici];
        /* Do differencing in x. */
        dcxli = cBdata[ici] - cBdata[ici - idxl];
        dcxui = cBdata[ici + idxu] - cBdata[ici];
        /* Collect terms and load cdot elements. */
        cBdotdata[ici] = -coy[i - 1] * (dcyui - dcyli) -
                         cox[i - 1] * (dcxui - dcxli) - fBsave[ici] - gu[i - 1];
      }
    }
  }

  return (0);
}